

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 start,UChar32 end)

{
  UChar32 UVar1;
  UChar32 UVar2;
  UChar32 local_24;
  int local_20;
  UChar32 range [3];
  UChar32 end_local;
  UChar32 start_local;
  UnicodeSet *this_local;
  
  range[1] = end;
  range[2] = start;
  UVar1 = pinCodePoint(range + 2);
  UVar2 = pinCodePoint(range + 1);
  if (UVar2 < UVar1) {
    clear(this);
  }
  else {
    local_24 = range[2];
    local_20 = range[1] + 1;
    range[0] = 0x110000;
    retain(this,&local_24,2,'\0');
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::retain(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 0);
    } else {
        clear();
    }
    return *this;
}